

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall
wabt::WastParser::ParseScriptModule
          (WastParser *this,
          unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_> *out_module)

{
  pointer *ppuVar1;
  _func_int **pp_Var2;
  ScriptModule *pSVar3;
  bool bVar4;
  Result RVar5;
  TokenType TVar6;
  TokenType TVar7;
  Result RVar8;
  ScriptModule *pSVar9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Token local_190;
  Token local_140;
  _Alloc_hider _Stack_f0;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  _func_int **pp_Stack_88;
  Location loc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  allocator_type local_39;
  ScriptModule *local_38;
  
  RVar5 = Expect(this,Lpar);
  RVar8.enum_ = Error;
  if (RVar5.enum_ == Error) {
    return (Result)Error;
  }
  GetToken((Token *)&stack0xffffffffffffff10,this);
  loc.filename.size_ = CONCAT71(name._M_string_length._1_7_,(undefined1)name._M_string_length);
  loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       name.field_2._M_allocated_capacity;
  pp_Stack_88 = (_func_int **)_Stack_f0._M_p;
  loc.filename.data_ = name._M_dataplus._M_p;
  Token::~Token((Token *)&stack0xffffffffffffff10);
  RVar5 = Expect(this,Module);
  if (RVar5.enum_ == Error) {
    return (Result)Error;
  }
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length._0_1_ = 0;
  _Stack_f0._M_p = (pointer)&name._M_string_length;
  ParseBindVarOpt(this,(string *)&stack0xffffffffffffff10);
  TVar6 = Peek(this,0);
  if (TVar6 == Bin) {
    Consume(&local_190,this);
    Token::~Token(&local_190);
    loc.field_1._8_8_ = 0;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    bVar4 = ParseTextListOpt(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  ((long)&loc.field_1 + 8));
    if (bVar4) {
      pSVar9 = (ScriptModule *)operator_new(0x68);
      pSVar9->_vptr_ScriptModule = (_func_int **)0x0;
      *(undefined8 *)&pSVar9->type_ = 0;
      pSVar9[2]._vptr_ScriptModule = (_func_int **)0x0;
      *(undefined8 *)&pSVar9[2].type_ = 0;
      pSVar9[1]._vptr_ScriptModule = (_func_int **)0x0;
      *(undefined8 *)&pSVar9[1].type_ = 0;
      pSVar9[3]._vptr_ScriptModule = (_func_int **)0x0;
      *(undefined8 *)&pSVar9[3].type_ = 0;
      pSVar9[4]._vptr_ScriptModule = (_func_int **)0x0;
      *(undefined8 *)&pSVar9[4].type_ = 0;
      pSVar9->type_ = Binary;
      pSVar9->_vptr_ScriptModule = (_func_int **)&PTR__DataScriptModule_015474e8;
      *(undefined8 *)&pSVar9[1].field_0xc = 0;
      *(undefined8 *)((long)&pSVar9[2]._vptr_ScriptModule + 4) = 0;
      pSVar9[3]._vptr_ScriptModule = (_func_int **)(pSVar9 + 4);
      pSVar9[5]._vptr_ScriptModule = (_func_int **)0x0;
      *(undefined8 *)&pSVar9[5].type_ = 0;
      pSVar9[6]._vptr_ScriptModule = (_func_int **)0x0;
      std::__cxx11::string::_M_assign((string *)(pSVar9 + 3),(string *)&stack0xffffffffffffff10);
LAB_00f60eaa:
      pSVar9[2]._vptr_ScriptModule = (_func_int **)loc.filename.size_;
      *(anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)&pSVar9[2].type_ =
           loc.field_1.field_1.offset;
      pSVar9[1]._vptr_ScriptModule = pp_Stack_88;
      *(char **)&pSVar9[1].type_ = loc.filename.data_;
      pp_Var2 = pSVar9[5]._vptr_ScriptModule;
      pSVar9[5]._vptr_ScriptModule = (_func_int **)loc.field_1._8_8_;
      *(pointer *)&pSVar9[5].type_ =
           data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      pSVar9[6]._vptr_ScriptModule =
           (_func_int **)
           data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      loc.field_1._8_8_ = 0;
      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if (pp_Var2 != (_func_int **)0x0) {
        operator_delete(pp_Var2);
      }
      pSVar3 = (out_module->_M_t).
               super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>.
               _M_t.
               super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>
               .super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl;
      (out_module->_M_t).
      super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>._M_t.
      super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>.
      super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl = pSVar9;
      if (pSVar3 != (ScriptModule *)0x0) {
        (*pSVar3->_vptr_ScriptModule[1])();
      }
    }
LAB_00f60f02:
    if (loc.field_1._8_8_ != 0) {
      operator_delete((void *)loc.field_1._8_8_);
    }
    RVar8.enum_ = Error;
    if (bVar4 == false) goto LAB_00f60f32;
  }
  else {
    if (TVar6 == Quote) {
      Consume(&local_140,this);
      Token::~Token(&local_140);
      loc.field_1._8_8_ = 0;
      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      bVar4 = ParseTextListOpt(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    ((long)&loc.field_1 + 8));
      if (bVar4) {
        pSVar9 = (ScriptModule *)operator_new(0x68);
        pSVar9->_vptr_ScriptModule = (_func_int **)0x0;
        *(undefined8 *)&pSVar9->type_ = 0;
        pSVar9[2]._vptr_ScriptModule = (_func_int **)0x0;
        *(undefined8 *)&pSVar9[2].type_ = 0;
        pSVar9[1]._vptr_ScriptModule = (_func_int **)0x0;
        *(undefined8 *)&pSVar9[1].type_ = 0;
        pSVar9[3]._vptr_ScriptModule = (_func_int **)0x0;
        *(undefined8 *)&pSVar9[3].type_ = 0;
        pSVar9[4]._vptr_ScriptModule = (_func_int **)0x0;
        *(undefined8 *)&pSVar9[4].type_ = 0;
        pSVar9->type_ = Quoted;
        pSVar9->_vptr_ScriptModule = (_func_int **)&PTR__DataScriptModule_01547550;
        *(undefined8 *)&pSVar9[1].field_0xc = 0;
        *(undefined8 *)((long)&pSVar9[2]._vptr_ScriptModule + 4) = 0;
        pSVar9[3]._vptr_ScriptModule = (_func_int **)(pSVar9 + 4);
        pSVar9[5]._vptr_ScriptModule = (_func_int **)0x0;
        *(undefined8 *)&pSVar9[5].type_ = 0;
        pSVar9[6]._vptr_ScriptModule = (_func_int **)0x0;
        std::__cxx11::string::_M_assign((string *)(pSVar9 + 3),(string *)&stack0xffffffffffffff10);
        goto LAB_00f60eaa;
      }
      goto LAB_00f60f02;
    }
    MakeUnique<wabt::TextScriptModule>();
    std::__cxx11::string::_M_assign((string *)(local_38 + 3),(string *)&stack0xffffffffffffff10);
    local_38[2]._vptr_ScriptModule = (_func_int **)loc.filename.size_;
    *(anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)&local_38[2].type_ =
         loc.field_1.field_1.offset;
    local_38[1]._vptr_ScriptModule = pp_Stack_88;
    *(char **)&local_38[1].type_ = loc.filename.data_;
    TVar6 = Peek(this,0);
    TVar7 = Peek(this,1);
    if (((TVar6 != Lpar) || (Last_Bare < TVar7)) ||
       ((0x2c008dd800U >> ((ulong)TVar7 & 0x3f) & 1) == 0)) {
      TVar6 = Peek(this,0);
      if (TVar6 == Rpar) goto LAB_00f60fe9;
      Match(this,Lpar);
      ppuVar1 = &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      loc.field_1._8_8_ = ppuVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&loc.field_1 + 8),"a module field","");
      __l._M_len = 1;
      __l._M_array = (iterator)((long)&loc.field_1 + 8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_a0,__l,&local_39);
      RVar8 = ErrorExpected(this,&local_a0,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_a0);
      if ((pointer *)loc.field_1._8_8_ != ppuVar1) {
        operator_delete((void *)loc.field_1._8_8_);
      }
LAB_00f61095:
      if (local_38 != (ScriptModule *)0x0) {
        (*local_38->_vptr_ScriptModule[1])();
      }
      goto LAB_00f60f32;
    }
    RVar5 = ParseModuleFieldList(this,(Module *)(local_38 + 1));
    if (RVar5.enum_ == Error) goto LAB_00f61095;
LAB_00f60fe9:
    pSVar3 = local_38;
    local_38 = (ScriptModule *)0x0;
    pSVar9 = (out_module->_M_t).
             super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>.
             _M_t.
             super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>.
             super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl;
    (out_module->_M_t).
    super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>._M_t.
    super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>.
    super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl = pSVar3;
    if ((pSVar9 != (ScriptModule *)0x0) &&
       ((*pSVar9->_vptr_ScriptModule[1])(), local_38 != (ScriptModule *)0x0)) {
      (*local_38->_vptr_ScriptModule[1])();
    }
  }
  RVar5 = Expect(this,Rpar);
  RVar8.enum_ = (Enum)(RVar5.enum_ == Error);
LAB_00f60f32:
  if ((size_type *)_Stack_f0._M_p != &name._M_string_length) {
    operator_delete(_Stack_f0._M_p);
  }
  return (Result)RVar8.enum_;
}

Assistant:

Result WastParser::ParseScriptModule(
    std::unique_ptr<ScriptModule>* out_module) {
  WABT_TRACE(ParseScriptModule);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Module);
  std::string name;
  ParseBindVarOpt(&name);

  switch (Peek()) {
    case TokenType::Bin: {
      Consume();
      std::vector<uint8_t> data;
      CHECK_RESULT(ParseTextList(&data));

      auto bsm = MakeUnique<BinaryScriptModule>();
      bsm->name = name;
      bsm->loc = loc;
      bsm->data = std::move(data);
      *out_module = std::move(bsm);
      break;
    }

    case TokenType::Quote: {
      Consume();
      std::vector<uint8_t> data;
      CHECK_RESULT(ParseTextList(&data));

      auto qsm = MakeUnique<QuotedScriptModule>();
      qsm->name = name;
      qsm->loc = loc;
      qsm->data = std::move(data);
      *out_module = std::move(qsm);
      break;
    }

    default: {
      auto tsm = MakeUnique<TextScriptModule>();
      tsm->module.name = name;
      tsm->module.loc = loc;
      if (IsModuleField(PeekPair())) {
        CHECK_RESULT(ParseModuleFieldList(&tsm->module));
      } else if (!PeekMatch(TokenType::Rpar)) {
        ConsumeIfLpar();
        return ErrorExpected({"a module field"});
      }
      *out_module = std::move(tsm);
      break;
    }
  }

  EXPECT(Rpar);
  return Result::Ok;
}